

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int iface_get_arptype(int fd,char *device,char *ebuf)

{
  undefined8 __s;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char local_48 [8];
  ifreq ifr;
  char *ebuf_local;
  char *device_local;
  int fd_local;
  
  ifr.ifr_ifru._16_8_ = ebuf;
  memset(local_48,0,0x28);
  strncpy(local_48,device,0x10);
  ifr.ifr_ifrn.ifrn_name[7] = '\0';
  iVar1 = ioctl(fd,0x8927,local_48);
  __s = ifr.ifr_ifru._16_8_;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf((char *)__s,0x100,"SIOCGIFHWADDR: %s",pcVar3);
    piVar2 = __errno_location();
    if (*piVar2 == 0x13) {
      device_local._4_4_ = 0xfffffffb;
    }
    else {
      device_local._4_4_ = 0xffffffff;
    }
  }
  else {
    device_local._4_4_ = (uint)(ushort)ifr.ifr_ifrn._8_2_;
  }
  return device_local._4_4_;
}

Assistant:

static int
iface_get_arptype(int fd, const char *device, char *ebuf)
{
	struct ifreq	ifr;

	memset(&ifr, 0, sizeof(ifr));
	strlcpy(ifr.ifr_name, device, sizeof(ifr.ifr_name));

	if (ioctl(fd, SIOCGIFHWADDR, &ifr) == -1) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			 "SIOCGIFHWADDR: %s", pcap_strerror(errno));
		if (errno == ENODEV) {
			/*
			 * No such device.
			 */
			return PCAP_ERROR_NO_SUCH_DEVICE;
		}
		return PCAP_ERROR;
	}

	return ifr.ifr_hwaddr.sa_family;
}